

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O3

QString * funcSig(QString *__return_storage_ptr__,Command *c,char *className)

{
  long lVar1;
  TypedName *pTVar2;
  char cVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  char16_t *pcVar7;
  undefined8 *puVar8;
  char *pcVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QArrayData *local_98;
  undefined8 *local_90;
  QArrayData *local_80;
  undefined8 *local_78;
  QArrayData *local_68;
  undefined8 *local_60;
  QArrayData *local_50;
  char16_t *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QString::toLocal8Bit_helper((QChar *)&local_50,(longlong)(c->cmd).type.d.ptr);
  pcVar7 = local_48;
  if (local_48 == (char16_t *)0x0) {
    pcVar7 = (char16_t *)&QByteArray::_empty;
  }
  bVar10 = className == (char *)0x0;
  if (bVar10) {
    className = "";
  }
  pcVar9 = "::";
  if (bVar10) {
    pcVar9 = "";
  }
  QString::toLocal8Bit_helper((QChar *)&local_68,(longlong)(c->cmd).name.d.ptr);
  puVar5 = local_60;
  if (local_60 == (undefined8 *)0x0) {
    puVar5 = &QByteArray::_empty;
  }
  QString::asprintf((char *)__return_storage_ptr__,"%s %s%s%s",pcVar7,className,pcVar9,puVar5);
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,1,0x10);
    }
  }
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,1,0x10);
    }
  }
  if ((c->args).d.size != 0) {
    QString::append((QChar)(char16_t)__return_storage_ptr__);
    lVar1 = (c->args).d.size;
    if (lVar1 != 0) {
      pTVar2 = (c->args).d.ptr;
      bVar10 = true;
      lVar4 = 0;
      do {
        if (!bVar10) {
          local_50 = (QArrayData *)0x0;
          local_48 = L", ";
          local_40 = 2;
          QString::append(__return_storage_ptr__);
          if (local_50 != (QArrayData *)0x0) {
            LOCK();
            (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_50,2,0x10);
            }
          }
        }
        QString::toLocal8Bit_helper
                  ((QChar *)&local_68,*(longlong *)((long)&(pTVar2->type).d.ptr + lVar4));
        puVar5 = local_60;
        if (local_60 == (undefined8 *)0x0) {
          puVar5 = &QByteArray::_empty;
        }
        cVar3 = QString::endsWith((QChar)((short)pTVar2 + 0x18 + (short)lVar4),0x2a);
        pcVar9 = anon_var_dwarf_19740 + 4;
        if (cVar3 != '\0') {
          pcVar9 = "";
        }
        QString::toLocal8Bit_helper
                  ((QChar *)&local_80,*(longlong *)((long)&(pTVar2->name).d.ptr + lVar4));
        puVar8 = local_78;
        if (local_78 == (undefined8 *)0x0) {
          puVar8 = &QByteArray::_empty;
        }
        QString::toLocal8Bit_helper
                  ((QChar *)&local_98,*(longlong *)((long)&(pTVar2->typeSuffix).d.ptr + lVar4));
        puVar6 = local_90;
        if (local_90 == (undefined8 *)0x0) {
          puVar6 = &QByteArray::_empty;
        }
        QString::asprintf((char *)&local_50,"%s%s%s%s",puVar5,pcVar9,puVar8,puVar6);
        QString::append(__return_storage_ptr__);
        if (local_50 != (QArrayData *)0x0) {
          LOCK();
          (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50,2,0x10);
          }
        }
        if (local_98 != (QArrayData *)0x0) {
          LOCK();
          (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_98,1,0x10);
          }
        }
        if (local_80 != (QArrayData *)0x0) {
          LOCK();
          (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_80,1,0x10);
          }
        }
        if (local_68 != (QArrayData *)0x0) {
          LOCK();
          (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_68,1,0x10);
          }
        }
        lVar4 = lVar4 + 0x48;
        bVar10 = false;
      } while (lVar1 * 0x48 != lVar4);
    }
    QString::append((QChar)(char16_t)__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString funcSig(const VkSpecParser::Command &c, const char *className = nullptr)
{
    QString s(QString::asprintf("%s %s%s%s", qPrintable(c.cmd.type),
                                (className ? className : ""), (className ? "::" : ""),
                                qPrintable(c.cmd.name)));
    if (!c.args.isEmpty()) {
        s += u'(';
        bool first = true;
        for (const VkSpecParser::TypedName &a : c.args) {
            if (!first)
                s += QStringLiteral(", ");
            else
                first = false;
            s += QString::asprintf("%s%s%s%s", qPrintable(a.type),
                                   (a.type.endsWith(u'*') ? "" : " "),
                                   qPrintable(a.name), qPrintable(a.typeSuffix));
        }
        s += u')';
    }
    return s;
}